

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrMan.c
# Opt level: O2

void Pdr_ManStop(Pdr_Man_t *p)

{
  uint uVar1;
  void **__ptr;
  sat_solver *s;
  Vec_Ptr_t *pVVar2;
  Pdr_Set_t *p_00;
  Vec_Int_t *pVVar3;
  void *pvVar4;
  int i;
  int iVar5;
  uint level;
  Aig_Man_t *p_01;
  Vec_Vec_t *p_02;
  long lVar6;
  int iVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  
  Gia_ManStopP(&p->pGia);
  Aig_ManCleanMarkAB(p->pAig);
  if (p->pPars->fVerbose != 0) {
    level = p->nCexesTotal;
    uVar1 = p->nStarts;
    Abc_Print(level,
              "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n",
              ((double)p->nCallsS * 100.0) / (double)p->nCalls,(ulong)(uint)p->nBlocks,
              (ulong)(uint)p->nObligs,(ulong)(uint)p->nCubes,(ulong)(uint)p->nCalls,(ulong)level);
    Abc_Print(level,"%s =","SAT solving",(ulong)uVar1);
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSat / 1000000.0,dVar9);
    Abc_Print(level,"%s =","  unsat    ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSatUnsat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatUnsat / 1000000.0,dVar9);
    Abc_Print(level,"%s =","  sat      ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tSatSat * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tSatSat / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Generalize ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tGeneral * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tGeneral / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Push clause");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tPush * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tPush / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Ternary sim");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tTsim * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tTsim / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Containment");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tContain * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tContain / 1000000.0,dVar9);
    Abc_Print(level,"%s =","CNF compute");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tCnf * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tCnf / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Refinement ");
    dVar9 = 0.0;
    if (p->tTotal != 0) {
      dVar9 = ((double)p->tAbs * 100.0) / (double)p->tTotal;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->tAbs / 1000000.0,dVar9);
    Abc_Print(level,"%s =","TOTAL      ");
    dVar9 = (double)p->tTotal;
    dVar10 = 0.0;
    if (p->tTotal != 0) {
      dVar10 = (dVar9 * 100.0) / dVar9;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar9 / 1000000.0,dVar10);
    fflush(_stdout);
  }
  for (iVar5 = 0; pVVar2 = p->vSolvers, iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
    s = (sat_solver *)Vec_PtrEntry(pVVar2,iVar5);
    sat_solver_delete(s);
  }
  Vec_PtrFree(pVVar2);
  iVar5 = 0;
  while( true ) {
    p_02 = p->vClauses;
    iVar7 = p_02->nSize;
    if (iVar7 <= iVar5) break;
    iVar7 = 0;
    while( true ) {
      pVVar2 = Vec_VecEntry(p_02,iVar5);
      if (pVVar2->nSize <= iVar7) break;
      pVVar2 = Vec_VecEntry(p->vClauses,iVar5);
      p_00 = (Pdr_Set_t *)Vec_PtrEntry(pVVar2,iVar7);
      Pdr_SetDeref(p_00);
      iVar7 = iVar7 + 1;
      p_02 = p->vClauses;
    }
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    pVVar2 = Vec_VecEntry(p_02,iVar5);
    if (pVVar2 != (Vec_Ptr_t *)0x0) {
      Vec_PtrFree(pVVar2);
    }
    iVar7 = p_02->nSize;
  }
  Vec_PtrFree((Vec_Ptr_t *)p_02);
  Pdr_QueueStop(p);
  if (p->pOrder != (int *)0x0) {
    free(p->pOrder);
    p->pOrder = (int *)0x0;
  }
  Vec_IntFree(p->vActVars);
  Cnf_DataFree(p->pCnf1);
  Vec_IntFreeP(&p->vVar2Reg);
  Cnf_DataFree(p->pCnf2);
  pVVar3 = p->pvId2Vars;
  if (pVVar3 != (Vec_Int_t *)0x0) {
    lVar6 = 8;
    for (lVar8 = 0; lVar8 < p->pAig->vObjs->nSize; lVar8 = lVar8 + 1) {
      pvVar4 = *(void **)((long)&pVVar3->nCap + lVar6);
      if (pvVar4 != (void *)0x0) {
        free(pvVar4);
        pVVar3 = p->pvId2Vars;
        *(undefined8 *)((long)&pVVar3->nCap + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    free(pVVar3);
    p->pvId2Vars = (Vec_Int_t *)0x0;
  }
  for (iVar5 = 0; iVar5 < (p->vVar2Ids).nSize; iVar5 = iVar5 + 1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids,iVar5);
    Vec_IntFree(pVVar3);
  }
  __ptr = (p->vVar2Ids).pArray;
  if (__ptr != (void **)0x0) {
    free(__ptr);
    (p->vVar2Ids).pArray = (void **)0x0;
  }
  if (p->vVLits != (Vec_Wec_t *)0x0) {
    Vec_WecFree(p->vVLits);
    p->vVLits = (Vec_Wec_t *)0x0;
  }
  Cnf_ManStop(p->pCnfMan);
  Vec_IntFreeP(&p->vAbsFlops);
  Vec_IntFreeP(&p->vMapFf2Ppi);
  Vec_IntFreeP(&p->vMapPpi2Ff);
  if (p->pPars->fNewXSim != 0) {
    Txs3_ManStop(p->pTxs3);
  }
  Vec_IntFreeP(&p->vPrio);
  Vec_IntFree(p->vLits);
  Vec_IntFree(p->vCiObjs);
  Vec_IntFree(p->vCoObjs);
  Vec_IntFree(p->vCiVals);
  Vec_IntFree(p->vCoVals);
  Vec_IntFree(p->vNodes);
  Vec_IntFree(p->vUndo);
  Vec_IntFree(p->vVisits);
  Vec_IntFree(p->vCi2Rem);
  Vec_IntFree(p->vRes);
  pVVar2 = p->vInfCubes;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      p->vInfCubes->pArray = (void **)0x0;
      pVVar2 = p->vInfCubes;
      if (pVVar2 == (Vec_Ptr_t *)0x0) goto LAB_004e2040;
    }
    free(pVVar2);
    p->vInfCubes = (Vec_Ptr_t *)0x0;
  }
LAB_004e2040:
  if (p->pTime4Outs != (abctime *)0x0) {
    free(p->pTime4Outs);
    p->pTime4Outs = (abctime *)0x0;
  }
  pVVar2 = p->vCexes;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    for (iVar5 = 0; iVar5 < pVVar2->nSize; iVar5 = iVar5 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar2,iVar5);
      if ((void *)0x2 < pvVar4) {
        free(pvVar4);
      }
    }
    Vec_PtrFree(pVVar2);
  }
  p_01 = p->pAig;
  if (p_01->pFanData != (int *)0x0) {
    Aig_ManFanoutStop(p_01);
    p_01 = p->pAig;
  }
  if (p_01->pTerSimData != (uint *)0x0) {
    free(p_01->pTerSimData);
    p->pAig->pTerSimData = (uint *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Pdr_ManStop( Pdr_Man_t * p )
{
    Pdr_Set_t * pCla;
    sat_solver * pSat;
    int i, k;
    Gia_ManStopP( &p->pGia );
    Aig_ManCleanMarkAB( p->pAig );
    if ( p->pPars->fVerbose ) 
    {
        Abc_Print( 1, "Block =%5d  Oblig =%6d  Clause =%6d  Call =%6d (sat=%.1f%%)  Cex =%4d  Start =%4d\n", 
            p->nBlocks, p->nObligs, p->nCubes, p->nCalls, 100.0 * p->nCallsS / p->nCalls, p->nCexesTotal, p->nStarts );
        ABC_PRTP( "SAT solving", p->tSat,       p->tTotal );
        ABC_PRTP( "  unsat    ", p->tSatUnsat,  p->tTotal );
        ABC_PRTP( "  sat      ", p->tSatSat,    p->tTotal );
        ABC_PRTP( "Generalize ", p->tGeneral,   p->tTotal );
        ABC_PRTP( "Push clause", p->tPush,      p->tTotal );
        ABC_PRTP( "Ternary sim", p->tTsim,      p->tTotal );
        ABC_PRTP( "Containment", p->tContain,   p->tTotal );
        ABC_PRTP( "CNF compute", p->tCnf,       p->tTotal );
        ABC_PRTP( "Refinement ", p->tAbs,       p->tTotal );
        ABC_PRTP( "TOTAL      ", p->tTotal,     p->tTotal );
        fflush( stdout );
    }
//    Abc_Print( 1, "SS =%6d. SU =%6d. US =%6d. UU =%6d.\n", p->nCasesSS, p->nCasesSU, p->nCasesUS, p->nCasesUU );
    Vec_PtrForEachEntry( sat_solver *, p->vSolvers, pSat, i )
        sat_solver_delete( pSat );
    Vec_PtrFree( p->vSolvers );
    Vec_VecForEachEntry( Pdr_Set_t *, p->vClauses, pCla, i, k )
        Pdr_SetDeref( pCla );
    Vec_VecFree( p->vClauses );
    Pdr_QueueStop( p );
    ABC_FREE( p->pOrder );
    Vec_IntFree( p->vActVars );
    // static CNF
    Cnf_DataFree( p->pCnf1 );
    Vec_IntFreeP( &p->vVar2Reg );
    // dynamic CNF
    Cnf_DataFree( p->pCnf2 );
    if ( p->pvId2Vars )
    for ( i = 0; i < Aig_ManObjNumMax(p->pAig); i++ )
        ABC_FREE( p->pvId2Vars[i].pArray );
    ABC_FREE( p->pvId2Vars );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vVar2Ids );
    for ( i = 0; i < Vec_PtrSize(&p->vVar2Ids); i++ )
        Vec_IntFree( (Vec_Int_t *)Vec_PtrEntry(&p->vVar2Ids, i) );
    ABC_FREE( p->vVar2Ids.pArray );
    Vec_WecFreeP( &p->vVLits );
    // CNF manager
    Cnf_ManStop( p->pCnfMan );
    Vec_IntFreeP( &p->vAbsFlops );
    Vec_IntFreeP( &p->vMapFf2Ppi );
    Vec_IntFreeP( &p->vMapPpi2Ff );
    // terminary simulation
    if ( p->pPars->fNewXSim )
        Txs3_ManStop( p->pTxs3 );
    // internal use
    Vec_IntFreeP( &p->vPrio   );  // priority flops
    Vec_IntFree( p->vLits     );  // array of literals
    Vec_IntFree( p->vCiObjs   );  // cone leaves
    Vec_IntFree( p->vCoObjs   );  // cone roots
    Vec_IntFree( p->vCiVals   );  // cone leaf values
    Vec_IntFree( p->vCoVals   );  // cone root values
    Vec_IntFree( p->vNodes    );  // cone nodes
    Vec_IntFree( p->vUndo     );  // cone undos
    Vec_IntFree( p->vVisits   );  // intermediate
    Vec_IntFree( p->vCi2Rem   );  // CIs to be removed
    Vec_IntFree( p->vRes      );  // final result
    Vec_PtrFreeP( &p->vInfCubes );
    ABC_FREE( p->pTime4Outs );
    if ( p->vCexes )
        Vec_PtrFreeFree( p->vCexes );
    // additional AIG data-members
    if ( p->pAig->pFanData != NULL )
        Aig_ManFanoutStop( p->pAig );
    if ( p->pAig->pTerSimData != NULL )
        ABC_FREE( p->pAig->pTerSimData );
    ABC_FREE( p );
}